

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformdatabuilder.cpp
# Opt level: O3

QHttpPart __thiscall
QFormDataPartBuilderPrivate::build(QFormDataPartBuilderPrivate *this,Options options)

{
  char16_t cVar1;
  ushort uVar2;
  char16_t *pcVar3;
  QHttpHeaders *this_00;
  Data *pDVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  qsizetype qVar7;
  uint in_EDX;
  long lVar8;
  storage_type *psVar9;
  undefined4 in_register_00000034;
  QFormDataPartBuilderPrivate *pQVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  qsizetype end;
  long in_FS_OFFSET;
  QLatin1StringView QVar14;
  QByteArrayView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QAnyStringView in;
  QMimeDatabase db;
  QArrayData *local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  QArrayData *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  QByteArray local_98;
  QByteArray local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  pQVar10 = (QFormDataPartBuilderPrivate *)
            CONCAT44(in_register_00000034,
                     options.super_QFlagsStorageHelper<QFormDataBuilder::Option,_4>.
                     super_QFlagsStorage<QFormDataBuilder::Option>.i);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_name).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QHttpPart::QHttpPart((QHttpPart *)this);
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char *)0x0;
  local_78.d.size = 0;
  lVar8 = 0;
  QByteArray::insert((longlong)&local_78,(QByteArrayView)(ZEXT816(0x11) << 0x40));
  pcVar3 = (pQVar10->m_name).d.ptr;
  lVar12 = (pQVar10->m_name).d.size;
  if (lVar12 != 0) {
    lVar8 = 0;
    lVar13 = 0;
    do {
      cVar1 = pcVar3[lVar13];
      if ((cVar1 == L'\\') || (cVar1 == L'\"')) {
        QVar16.m_data = (storage_type_conflict *)(lVar13 - lVar8);
        QVar16.m_size = (qsizetype)&local_58;
        QUtf8::convertFromUnicode(QVar16);
        QByteArray::append(&local_78);
        if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_58.shared = *(int *)local_58.shared + -1;
          UNLOCK();
          if (*(int *)local_58.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_58.shared,1,0x10);
          }
        }
        QByteArray::append((char)&local_78);
        lVar8 = lVar13;
      }
      lVar13 = lVar13 + 1;
    } while (lVar12 != lVar13);
  }
  QVar17.m_data = (storage_type_conflict *)(lVar12 - lVar8);
  QVar17.m_size = (qsizetype)&local_58;
  QUtf8::convertFromUnicode(QVar17);
  QByteArray::append(&local_78);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,1,0x10);
    }
  }
  QVar15.m_data = (storage_type *)0x1;
  QVar15.m_size = local_78.d.size;
  QByteArray::insert((longlong)&local_78,QVar15);
  pcVar3 = (pQVar10->m_originalBodyName).d.ptr;
  if (pcVar3 != (char16_t *)0x0) {
    lVar12 = (pQVar10->m_originalBodyName).d.size;
    if (lVar12 == 0) {
      iVar11 = 0;
    }
    else {
      lVar8 = 0;
      iVar11 = 0;
      do {
        uVar2 = *(ushort *)((long)pcVar3 + lVar8);
        if (0xff < uVar2) {
          iVar11 = 2;
          break;
        }
        if (0x7f < uVar2) {
          iVar11 = 1;
        }
        lVar8 = lVar8 + 2;
      } while (lVar12 * 2 != lVar8);
    }
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (QMimeDatabase *)0x0;
    local_58._16_8_ = 0;
    if (((in_EDX & 4) == 0) || (iVar11 == 2)) {
      QString::toUtf8_helper((QString *)&local_98);
    }
    else {
      QString::toLatin1_helper((QString *)&local_98);
    }
    uVar6 = local_58._8_8_;
    uVar5 = local_58.shared;
    qVar7 = local_98.d.size;
    pDVar4 = local_98.d.d;
    local_98.d.d = (Data *)local_58.shared;
    local_58.shared = (PrivateShared *)pDVar4;
    local_58._8_8_ = local_98.d.ptr;
    local_98.d.ptr = (char *)uVar6;
    local_98.d.size = local_58._16_8_;
    local_58._16_8_ = qVar7;
    if ((QArrayData *)uVar5 != (QArrayData *)0x0) {
      LOCK();
      *(int *)uVar5 = *(int *)uVar5 + -1;
      UNLOCK();
      if (*(int *)uVar5 == 0) {
        QArrayData::deallocate((QArrayData *)uVar5,1,0x10);
      }
    }
    QVar18.m_data = (storage_type *)0xc;
    QVar18.m_size = local_78.d.size;
    QByteArray::insert((longlong)&local_78,QVar18);
    uVar6 = local_58._16_8_;
    uVar5 = local_58._8_8_;
    if ((in_EDX & 2) == 0) {
      if (local_58._16_8_ != 0) {
        lVar12 = 0;
        do {
          if ((*(QMimeDatabase *)(uVar5 + lVar12) == (QMimeDatabase)0x5c) ||
             (*(QMimeDatabase *)(uVar5 + lVar12) == (QMimeDatabase)0x22)) {
            QByteArray::append((char)&local_78);
          }
          QByteArray::append((char)&local_78);
          lVar12 = lVar12 + 1;
        } while (uVar6 != lVar12);
      }
    }
    else {
      local_a8 = 0;
      local_b8 = (QArrayData *)0x0;
      uStack_b0 = 0;
      local_c8 = 0;
      local_d8 = (QArrayData *)0x0;
      uStack_d0 = 0;
      QByteArray::toPercentEncoding(&local_98,(QByteArray *)&local_58,(char)&local_b8);
      QByteArray::append(&local_78);
      if ((QFormDataPartBuilderPrivate *)local_98.d.d != (QFormDataPartBuilderPrivate *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)&(local_98.d.d)->super_QArrayData)->d).d)->_M_i =
             ((__atomic_base<int> *)&(((QString *)&(local_98.d.d)->super_QArrayData)->d).d)->_M_i +
             -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(((QString *)&(local_98.d.d)->super_QArrayData)->d).d)->_M_i ==
            0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (local_d8 != (QArrayData *)0x0) {
        LOCK();
        (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_d8,1,0x10);
        }
      }
      if (local_b8 != (QArrayData *)0x0) {
        LOCK();
        (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_b8,1,0x10);
        }
      }
    }
    QVar19.m_data = (storage_type *)0x1;
    QVar19.m_size = local_78.d.size;
    QByteArray::insert((longlong)&local_78,QVar19);
    if ((in_EDX & 1) == 0 && iVar11 != 0) {
      if (((in_EDX & 4) == 0) || (iVar11 != 1)) {
        psVar9 = (storage_type *)0x13;
      }
      else {
        psVar9 = &DAT_00000018;
      }
      QVar20.m_data = psVar9;
      QVar20.m_size = local_78.d.size;
      QByteArray::insert((longlong)&local_78,QVar20);
      local_a8 = 0;
      local_b8 = (QArrayData *)0x0;
      uStack_b0 = 0;
      local_c8 = 0;
      local_d8 = (QArrayData *)0x0;
      uStack_d0 = 0;
      QByteArray::toPercentEncoding(&local_98,(QByteArray *)&local_58,(char)&local_b8);
      QByteArray::append(&local_78);
      if ((QFormDataPartBuilderPrivate *)local_98.d.d != (QFormDataPartBuilderPrivate *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)&(local_98.d.d)->super_QArrayData)->d).d)->_M_i =
             ((__atomic_base<int> *)&(((QString *)&(local_98.d.d)->super_QArrayData)->d).d)->_M_i +
             -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(((QString *)&(local_98.d.d)->super_QArrayData)->d).d)->_M_i ==
            0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (local_d8 != (QArrayData *)0x0) {
        LOCK();
        (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_d8,1,0x10);
        }
      }
      if (local_b8 != (QArrayData *)0x0) {
        LOCK();
        (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_b8,1,0x10);
        }
      }
    }
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,1,0x10);
      }
    }
  }
  if ((pQVar10->m_mimeType).d.size == 0) {
    local_b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    QMimeDatabase::QMimeDatabase((QMimeDatabase *)&local_b8);
    lVar12 = (long)(char)*(__index_type *)
                          ((long)&(pQVar10->m_body).super__Variant_base<QIODevice_*,_QByteArray>.
                                  super__Move_assign_alias<QIODevice_*,_QByteArray>.
                                  super__Copy_assign_alias<QIODevice_*,_QByteArray>.
                                  super__Move_ctor_alias<QIODevice_*,_QByteArray> + 0x18);
    local_98.d.d = (Data *)pQVar10;
    local_98.d.ptr = (char *)&local_b8;
    if (lVar12 == -1) {
      abort();
    }
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<QMimeType>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qformdatabuilder.cpp:316:44)_&&,_std::variant<QIODevice_*,_QByteArray>_&>
      ::_S_vtable._M_arr[lVar12]._M_data)
              ((QMimeType *)&local_d8,(anon_class_16_2_e8807ff9 *)&local_98,&pQVar10->m_body);
    QMimeType::name();
    in.m_size = local_58._16_8_ + 0x8000000000000000;
    in.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_58._8_8_;
    convertInto(&pQVar10->m_mimeType,in);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    QMimeType::~QMimeType((QMimeType *)&local_d8);
    QMimeDatabase::~QMimeDatabase((QMimeDatabase *)&local_b8);
  }
  this_00 = &pQVar10->m_httpHeaders;
  qVar7 = QHttpHeaders::size(this_00);
  if (0 < qVar7) {
    lVar12 = 0;
    do {
      QVar14 = QHttpHeaders::nameAt(this_00,lVar12);
      QByteArray::QByteArray((QByteArray *)&local_58,QVar14.m_data,QVar14.m_size);
      QVar15 = QHttpHeaders::valueAt(this_00,lVar12);
      QByteArray::QByteArray(&local_98,QVar15.m_data,QVar15.m_size);
      QHttpPart::setRawHeader((QHttpPart *)this,(QByteArray *)&local_58,&local_98);
      if ((QFormDataPartBuilderPrivate *)local_98.d.d != (QFormDataPartBuilderPrivate *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)&(local_98.d.d)->super_QArrayData)->d).d)->_M_i =
             ((__atomic_base<int> *)&(((QString *)&(local_98.d.d)->super_QArrayData)->d).d)->_M_i +
             -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(((QString *)&(local_98.d.d)->super_QArrayData)->d).d)->_M_i ==
            0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
        }
      }
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,1,0x10);
        }
      }
      lVar12 = lVar12 + 1;
      qVar7 = QHttpHeaders::size(this_00);
    } while (lVar12 < qVar7);
  }
  if ((pQVar10->m_mimeType).d.size != 0) {
    QVariant::QVariant((QVariant *)&local_58,&pQVar10->m_mimeType);
    QHttpPart::setHeader((QHttpPart *)this,ContentTypeHeader,(QVariant *)&local_58);
    QVariant::~QVariant((QVariant *)&local_58);
  }
  QVariant::QVariant((QVariant *)&local_58,&local_78);
  QHttpPart::setHeader((QHttpPart *)this,ContentDispositionHeader,(QVariant *)&local_58);
  QVariant::~QVariant((QVariant *)&local_58);
  if (*(__index_type *)
       ((long)&(pQVar10->m_body).super__Variant_base<QIODevice_*,_QByteArray>.
               super__Move_assign_alias<QIODevice_*,_QByteArray>.
               super__Copy_assign_alias<QIODevice_*,_QByteArray>.
               super__Move_ctor_alias<QIODevice_*,_QByteArray> + 0x18) == '\0') {
    QHttpPart::setBodyDevice
              ((QHttpPart *)this,
               *(QIODevice **)
                &(pQVar10->m_body).super__Variant_base<QIODevice_*,_QByteArray>.
                 super__Move_assign_alias<QIODevice_*,_QByteArray>.
                 super__Copy_assign_alias<QIODevice_*,_QByteArray>.
                 super__Move_ctor_alias<QIODevice_*,_QByteArray>);
  }
  else {
    QHttpPart::setBody((QHttpPart *)this,(QByteArray *)&pQVar10->m_body);
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QSharedDataPointer<QHttpPartPrivate>)(QSharedDataPointer<QHttpPartPrivate>)this;
}

Assistant:

QHttpPart QFormDataPartBuilderPrivate::build(QFormDataBuilder::Options options)
{
    QHttpPart httpPart;

    using Opt = QFormDataBuilder::Option;

    QByteArray headerValue;

    headerValue += "form-data; name=\"";
    escapeNameAndAppend(headerValue, m_name);
    headerValue += "\"";

    if (!m_originalBodyName.isNull()) {

        enum class Encoding { ASCII, Latin1, Utf8 } encoding = Encoding::ASCII;
        for (QChar c : std::as_const(m_originalBodyName)) {
            if (c > u'\xff') {
                encoding = Encoding::Utf8;
                break;
            } else if (c > u'\x7f') {
                encoding = Encoding::Latin1;
            }
        }
        QByteArray enc;
        if ((options & Opt::PreferLatin1EncodedFilename) && encoding != Encoding::Utf8)
            enc = m_originalBodyName.toLatin1();
        else
            enc = m_originalBodyName.toUtf8();

        headerValue += "; filename=\"";
        if (options & Opt::UseRfc7578PercentEncodedFilename)
            headerValue += enc.toPercentEncoding();
        else
            escapeNameAndAppend(headerValue, enc);
        headerValue += "\"";
        if (encoding != Encoding::ASCII && !(options & Opt::OmitRfc8187EncodedFilename)) {
            // For 'filename*' production see
            // https://datatracker.ietf.org/doc/html/rfc5987#section-3.2.1
            // For providing both filename and filename* parameters see
            // https://datatracker.ietf.org/doc/html/rfc6266#section-4.3 and
            // https://datatracker.ietf.org/doc/html/rfc8187#section-4.2
            if ((options & Opt::PreferLatin1EncodedFilename) && encoding == Encoding::Latin1)
                headerValue += "; filename*=ISO-8859-1''";
            else
                headerValue += "; filename*=UTF-8''";
            headerValue += enc.toPercentEncoding();
        }
    }

#if QT_CONFIG(mimetype)
    if (m_mimeType.isEmpty()) {
        // auto-detect
        QMimeDatabase db;
        convertInto(m_mimeType, std::visit([&](auto &arg) {
                return db.mimeTypeForFileNameAndData(m_originalBodyName, arg);
            }, m_body).name());
    }
#endif

    for (qsizetype i = 0; i < m_httpHeaders.size(); i++) {
        httpPart.setRawHeader(QByteArrayView(m_httpHeaders.nameAt(i)).toByteArray(),
                                             m_httpHeaders.valueAt(i).toByteArray());
    }

    if (!m_mimeType.isEmpty())
        httpPart.setHeader(QNetworkRequest::ContentTypeHeader, m_mimeType);

    httpPart.setHeader(QNetworkRequest::ContentDispositionHeader, std::move(headerValue));

    if (auto d = std::get_if<QIODevice*>(&m_body))
        httpPart.setBodyDevice(*d);
    else if (auto b = std::get_if<QByteArray>(&m_body))
        httpPart.setBody(*b);
    else
        Q_UNREACHABLE();

    return httpPart;
}